

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

bool __thiscall ON_DimStyle::FontSubstituted(ON_DimStyle *this)

{
  bool bVar1;
  int iVar2;
  bool local_3e;
  undefined1 local_30 [24];
  ON_DimStyle *local_18;
  ON_DimStyle *this_local;
  
  local_30[0xf] = 0;
  bVar1 = false;
  local_3e = true;
  local_18 = this;
  if (this->m_managed_font != (ON_Font *)0x0) {
    iVar2 = ON_Font::CompareFontCharacteristics(this->m_managed_font,&this->m_font_characteristics);
    local_3e = true;
    if (iVar2 == 0) {
      ON_Font::Description((ON_Font *)(local_30 + 0x10));
      local_30[0xf] = 1;
      ON_Font::Description((ON_Font *)local_30);
      bVar1 = true;
      local_3e = ::operator!=((ON_wString *)(local_30 + 0x10),(ON_wString *)local_30);
    }
  }
  this_local._7_1_ = local_3e;
  if (bVar1) {
    ON_wString::~ON_wString((ON_wString *)local_30);
  }
  if ((local_30[0xf] & 1) != 0) {
    ON_wString::~ON_wString((ON_wString *)(local_30 + 0x10));
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

const bool ON_DimStyle::FontSubstituted() const
{
  return
    (nullptr == m_managed_font)
    || (0 != ON_Font::CompareFontCharacteristics(*m_managed_font, m_font_characteristics))
    || (m_managed_font->Description() != m_font_characteristics.Description())
    ;
}